

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

l2_expr_info *
l2_eval_expr_mul_div_mod1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  l2_expr_info left_expr_info_00;
  l2_expr_val_type lVar1;
  boolean bVar2;
  l2_token *plVar3;
  char *pcVar4;
  int cols;
  int lines;
  char *pcVar5;
  char *pcVar6;
  l2_expr_info new_left_expr_info;
  
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_MUL);
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_DIV);
    if (bVar2 == '\0') {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_MOD);
      if (bVar2 == '\0') {
        (__return_storage_ptr__->val).procedure.upper_scope_p =
             left_expr_info.val.procedure.upper_scope_p;
        *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
        (__return_storage_ptr__->val).real = left_expr_info.val.real;
        return __return_storage_ptr__;
      }
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_single(&new_left_expr_info,scope_p);
      lVar1 = new_left_expr_info.val_type;
      new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (lVar1 == L2_EXPR_VAL_TYPE_INTEGER) {
          new_left_expr_info.val.integer =
               left_expr_info.val.integer % new_left_expr_info.val.integer;
          goto LAB_001092b8;
        }
        if (lVar1 == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = "%";
          pcVar5 = "integer";
          goto LAB_001094cd;
        }
        if (lVar1 == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = "%";
          goto LAB_00109437;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (lVar1 == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = "%";
LAB_001094dd:
            pcVar5 = "real";
LAB_001094e4:
            pcVar6 = "bool";
            goto LAB_001094ee;
          }
          if (lVar1 == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = "%";
            pcVar5 = "real";
            pcVar6 = pcVar5;
            goto LAB_001094ee;
          }
          if (lVar1 != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010944b;
          pcVar4 = "%";
          pcVar5 = "real";
LAB_001093fe:
          pcVar6 = "integer";
LAB_001094ee:
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,lines,cols
                           ,pcVar4,pcVar5,pcVar6);
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (lVar1 != L2_EXPR_VAL_TYPE_BOOL) {
            if (lVar1 != L2_EXPR_VAL_TYPE_REAL) {
              if (lVar1 != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010944b;
              pcVar4 = "%";
              goto LAB_001093f7;
            }
            pcVar4 = "%";
            goto LAB_001094c6;
          }
          pcVar4 = "%";
LAB_0010950c:
          pcVar5 = "bool";
          pcVar6 = pcVar5;
          goto LAB_001094ee;
        }
      }
    }
    else {
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_single(&new_left_expr_info,scope_p);
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
          l2_eval_div_by_zero_filter
                    ((int)new_left_expr_info.val.integer,plVar3->current_line,plVar3->current_col);
          new_left_expr_info.val.integer =
               left_expr_info.val.integer / (long)(int)new_left_expr_info.val.integer;
          goto LAB_001092b8;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          left_expr_info.val.real = (double)left_expr_info.val.integer;
          goto LAB_001092ae;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = "/";
LAB_00109437:
          pcVar5 = "integer";
          goto LAB_001094e4;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
            new_left_expr_info.val.real = (double)new_left_expr_info.val.integer;
          }
          else if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
              lines = plVar3->current_line;
              cols = plVar3->current_col;
              pcVar4 = "/";
              goto LAB_001094dd;
            }
            goto LAB_00109443;
          }
LAB_001092ae:
          new_left_expr_info.val.real = left_expr_info.val.real / new_left_expr_info.val.real;
          goto LAB_001092b2;
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = "/";
            goto LAB_0010950c;
          }
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = "/";
            goto LAB_001094c6;
          }
          if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010944b;
          pcVar4 = "/";
LAB_001093f7:
          pcVar5 = "bool";
          goto LAB_001093fe;
        }
      }
    }
  }
  else {
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_single(&new_left_expr_info,scope_p);
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        new_left_expr_info.val.integer = new_left_expr_info.val.integer * left_expr_info.val.integer
        ;
        goto LAB_001092b8;
      }
      if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
        new_left_expr_info.val.real =
             new_left_expr_info.val.real * (double)left_expr_info.val.integer;
        goto LAB_001092b8;
      }
      if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "*";
        goto LAB_00109437;
      }
    }
    else {
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          new_left_expr_info.val.real = (double)new_left_expr_info.val.integer;
        }
        else if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            lines = plVar3->current_line;
            cols = plVar3->current_col;
            pcVar4 = "*";
            goto LAB_001094dd;
          }
          goto LAB_00109443;
        }
        new_left_expr_info.val.real = new_left_expr_info.val.real * left_expr_info.val.real;
LAB_001092b2:
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
LAB_001092b8:
        left_expr_info_00._4_4_ = new_left_expr_info._4_4_;
        left_expr_info_00.val_type = new_left_expr_info.val_type;
        left_expr_info_00.val.real = new_left_expr_info.val.real;
        left_expr_info_00.val.procedure.upper_scope_p =
             new_left_expr_info.val.procedure.upper_scope_p;
        l2_eval_expr_lshift_rshift_rshift_unsigned1
                  (__return_storage_ptr__,scope_p,left_expr_info_00);
        return __return_storage_ptr__;
      }
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          pcVar4 = "*";
          goto LAB_0010950c;
        }
        if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_REAL) {
          if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_0010944b;
          pcVar4 = "*";
          goto LAB_001093f7;
        }
        pcVar4 = "*";
LAB_001094c6:
        pcVar5 = "bool";
LAB_001094cd:
        pcVar6 = "real";
        goto LAB_001094ee;
      }
    }
  }
LAB_00109443:
  lines = plVar3->current_line;
  cols = plVar3->current_col;
LAB_0010944b:
  l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,lines,cols);
}

Assistant:

l2_expr_info l2_eval_expr_mul_div_mod1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_MUL) /* * */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_single(scope_p);
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                        new_left_expr_info.val.integer = (left_expr_info.val.integer * right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.integer * right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real * right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "*", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real * right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_DIV) /* / */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_single(scope_p);
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                        new_left_expr_info.val.integer = (left_expr_info.val.integer / l2_eval_div_by_zero_filter(right_expr_info.val.integer, current_token_p->current_line, current_token_p->current_col));
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.integer / right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real / right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "/", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                        new_left_expr_info.val.real = (left_expr_info.val.real / right_expr_info.val.real);
                        break;

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_MOD) /* % */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_single(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer % right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "%", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}